

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Curve25519.c
# Opt level: O1

void Hacl_EC_Point_swap_conditional_(uint64_t *a,uint64_t *b,uint64_t swap1,uint32_t ctr)

{
  ulong uVar1;
  ulong uVar2;
  
  while (ctr = ctr - 1, ctr != 0xffffffff) {
    uVar1 = b[ctr];
    uVar2 = (uVar1 ^ a[ctr]) & swap1;
    a[ctr] = a[ctr] ^ uVar2;
    b[ctr] = uVar2 ^ uVar1;
  }
  return;
}

Assistant:

static void
Hacl_EC_Point_swap_conditional_(uint64_t *a, uint64_t *b, uint64_t swap1, uint32_t ctr)
{
  if (!(ctr == (uint32_t)0U))
  {
    uint32_t i;
    Hacl_EC_Point_swap_conditional_step(a, b, swap1, ctr);
    i = ctr - (uint32_t)1U;
    Hacl_EC_Point_swap_conditional_(a, b, swap1, i);
  }
}